

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

void __thiscall ipx::Basis::UnfixVariables(Basis *this)

{
  pointer piVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  piVar1 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = this->model_->num_cols_ + this->model_->num_rows_;
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if (piVar1[uVar4] == -2) {
      piVar1[uVar4] = -1;
    }
  }
  return;
}

Assistant:

void Basis::UnfixVariables() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    for (Int j = 0; j < n+m; j++)
        if (map2basis_[j] == -2)
            map2basis_[j] = -1;
}